

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

void __thiscall
glslang::TSymbolTable::setVariableExtensions
          (TSymbolTable *this,char *blockName,char *name,int numExts,char **extensions)

{
  pointer pTVar1;
  int iVar2;
  TSymbol *pTVar3;
  undefined4 extraout_var;
  long *plVar5;
  TType *this_00;
  TTypeList *pTVar6;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_01;
  long lVar7;
  int member;
  ulong uVar8;
  pool_allocator<char> local_60;
  TString local_58;
  long *plVar4;
  
  local_60.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
             blockName,&local_60);
  pTVar3 = find(this,&local_58,(bool *)0x0,(bool *)0x0,(int *)0x0);
  if (pTVar3 != (TSymbol *)0x0) {
    iVar2 = (*pTVar3->_vptr_TSymbol[9])(pTVar3);
    plVar4 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar4 == (long *)0x0) {
      __assert_fail("variable != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                    ,0x38a,
                    "void glslang::TSymbolTable::setVariableExtensions(const char *, const char *, int, const char *const *)"
                   );
    }
    plVar5 = (long *)(**(code **)(*plVar4 + 0x48))(plVar4);
    this_00 = (TType *)(**(code **)(*plVar5 + 0x60))(plVar5);
    pTVar6 = TType::getStruct(this_00);
    lVar7 = 0;
    for (uVar8 = 0;
        pTVar1 = (pTVar6->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        (long)uVar8 <
        (long)(int)((ulong)((long)(pTVar6->
                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ).
                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) >> 5);
        uVar8 = uVar8 + 1) {
      this_01 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                (**(code **)(**(long **)((long)&pTVar1->type + lVar7) + 0x30))();
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (this_01,name);
      if (iVar2 == 0) {
        (**(code **)(*plVar4 + 0xf0))(plVar4,uVar8 & 0xffffffff,numExts,extensions);
        return;
      }
      lVar7 = lVar7 + 0x20;
    }
  }
  return;
}

Assistant:

void setVariableExtensions(const char* blockName, const char* name, int numExts, const char* const extensions[])
    {
        TSymbol* symbol = find(TString(blockName));
        if (symbol == nullptr)
            return;
        TVariable* variable = symbol->getAsVariable();
        assert(variable != nullptr);

        const TTypeList& structure = *variable->getAsVariable()->getType().getStruct();
        for (int member = 0; member < (int)structure.size(); ++member) {
            if (structure[member].type->getFieldName().compare(name) == 0) {
                variable->setMemberExtensions(member, numExts, extensions);
                return;
            }
        }
    }